

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O0

void __thiscall StunMsg_ErrorResponse_Test::TestBody(StunMsg_ErrorResponse_Test *this)

{
  stun_msg_hdr *msg_hdr_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_350;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_10;
  Message local_328;
  uint16_t local_31a;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_9;
  size_t i;
  Message local_2f8;
  size_t local_2f0;
  unsigned_long local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_8;
  stun_attr_unknown *attr_unk;
  Message local_2c0;
  uint16_t local_2b6;
  stun_attr_type local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_280;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__1;
  Message local_258;
  size_t local_250;
  unsigned_long local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_6;
  Message local_228;
  int local_220 [2];
  undefined1 local_218 [8];
  AssertionResult gtest_ar_5;
  stun_attr_errcode *attr_errcode;
  Message local_1f8;
  uint16_t local_1ee;
  stun_attr_type local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_4;
  stun_attr_hdr *attr_hdr;
  Message local_1c8;
  size_t local_1c0;
  unsigned_long local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_3;
  Message local_198;
  uint16_t local_18e;
  stun_msg_type local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  Message local_130;
  int local_128 [2];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_108;
  Message local_100 [3];
  unsigned_long local_e8 [2];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  uint16_t unknown [3];
  uint8_t tsx_id [12];
  stun_msg_hdr *msg_hdr;
  uint8_t buffer [60];
  uint8_t expected_result [60];
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char reason_phrase [18];
  StunMsg_ErrorResponse_Test *this_local;
  
  builtin_memcpy(expected_result + 0x38,"Unkn",4);
  cStack_24 = 'o';
  cStack_23 = 'w';
  cStack_22 = 'n';
  cStack_21 = ' ';
  expected_result[0x28] = '\0';
  expected_result[0x29] = '\n';
  expected_result[0x2a] = '\0';
  expected_result[0x2b] = '\x06';
  expected_result[0x2c] = '\0';
  expected_result[0x2d] = '\x1a';
  expected_result[0x2e] = '\0';
  expected_result[0x2f] = '\x1b';
  expected_result[0x30] = 0x80;
  expected_result[0x31] = ',';
  expected_result[0x32] = '\0';
  expected_result[0x33] = '\0';
  builtin_memcpy(expected_result + 0x18,"own Attribute",0xe);
  expected_result[0x26] = '\0';
  expected_result[0x27] = '\0';
  expected_result[8] = ')';
  expected_result[9] = 0xda;
  expected_result[10] = 'A';
  expected_result[0xb] = '.';
  expected_result[0xc] = '\0';
  expected_result[0xd] = '\t';
  expected_result[0xe] = '\0';
  expected_result[0xf] = '\x15';
  expected_result[0x10] = '\0';
  expected_result[0x11] = '\0';
  expected_result[0x12] = '\x04';
  expected_result[0x13] = '\x14';
  expected_result[0x14] = 'U';
  expected_result[0x15] = 'n';
  expected_result[0x16] = 'k';
  expected_result[0x17] = 'n';
  stack0xffffffffffffff98 = 0x42a4122128001101;
  expected_result[0] = 'x';
  expected_result[1] = 0xad;
  expected_result[2] = '4';
  expected_result[3] = '3';
  expected_result[4] = 0xc6;
  expected_result[5] = 0xad;
  expected_result[6] = 'r';
  expected_result[7] = 0xc0;
  _unknown = 0xc072adc63334ad78;
  gtest_ar.message_.ptr_._4_2_ = 0x802c;
  gtest_ar.message_.ptr_._0_4_ = 0x1b001a;
  local_e8[1] = 0x3c;
  local_e8[0] = 0x3c;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_d8,"sizeof(expected_result)","sizeof(buffer)",local_e8 + 1,
             local_e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x224,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(local_100);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_128[1] = 1;
    local_128[0] = stun_msg_verify((stun_msg_hdr *)(buffer + 0x38),0x3c);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_120,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               local_128 + 1,local_128);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar2) {
      testing::Message::Message(&local_130);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x226,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_130);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_130);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      stun_msg_hdr_init((stun_msg_hdr *)&msg_hdr,0x111,(uint8_t *)unknown);
      stun_attr_errcode_add((stun_msg_hdr *)&msg_hdr,0x1a4,(char *)(expected_result + 0x38),'\0');
      stun_attr_unknown_add((stun_msg_hdr *)&msg_hdr,(uint16_t *)&gtest_ar.message_,3,'\0');
      anon_unknown.dwarf_39c4::IsEqual
                ((anon_unknown_dwarf_39c4 *)local_148,buffer + 0x38,&msg_hdr,0x3c);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar2) {
        testing::Message::Message(&local_150);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_148,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x22d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_150);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      msg_hdr_00 = (stun_msg_hdr *)(buffer + 0x38);
      local_18c = STUN_BINDING_ERROR_RESPONSE;
      local_18e = stun_msg_type(msg_hdr_00);
      testing::internal::EqHelper<false>::Compare<stun_msg_type,unsigned_short>
                ((EqHelper<false> *)local_188,"STUN_BINDING_ERROR_RESPONSE","stun_msg_type(msg_hdr)"
                 ,&local_18c,&local_18e);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar2) {
        testing::Message::Message(&local_198);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x231,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_198);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      local_1b8 = 0x3c;
      local_1c0 = stun_msg_len(msg_hdr_00);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_1b0,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 &local_1b8,&local_1c0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar2) {
        testing::Message::Message(&local_1c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&attr_hdr,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x232,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&attr_hdr,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&attr_hdr);
        testing::Message::~Message(&local_1c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           stun_msg_next_attr(msg_hdr_00,(stun_attr_hdr *)0x0);
      local_1ec = STUN_ATTR_ERROR_CODE;
      local_1ee = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                ((EqHelper<false> *)local_1e8,"STUN_ATTR_ERROR_CODE","stun_attr_type(attr_hdr)",
                 &local_1ec,&local_1ee);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
      if (!bVar2) {
        testing::Message::Message(&local_1f8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&attr_errcode,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x235,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&attr_errcode,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&attr_errcode);
        testing::Message::~Message(&local_1f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
      gtest_ar_5.message_ = gtest_ar_4.message_;
      local_220[1] = 0x1a4;
      local_220[0] = stun_attr_errcode_status((stun_attr_errcode *)gtest_ar_4.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_218,"420","stun_attr_errcode_status(attr_errcode)",
                 local_220 + 1,local_220);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
      if (!bVar2) {
        testing::Message::Message(&local_228);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x237,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_228);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_228);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
      local_248 = 0x11;
      local_250 = stun_attr_errcode_reason_len((stun_attr_errcode *)gtest_ar_5.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_240,"sizeof(reason_phrase)-1",
                 "stun_attr_errcode_reason_len(attr_errcode)",&local_248,&local_250);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
      if (!bVar2) {
        testing::Message::Message(&local_258);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x239,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_258)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_258);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        pcVar3 = stun_attr_errcode_reason((stun_attr_errcode *)gtest_ar_5.message_.ptr_);
        anon_unknown.dwarf_39c4::IsEqual
                  ((anon_unknown_dwarf_39c4 *)local_270,expected_result + 0x38,pcVar3,0x11);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
        if (!bVar2) {
          testing::Message::Message(&local_278);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_7.message_,(internal *)local_270,
                     (AssertionResult *)
                     "IsEqual(reason_phrase, stun_attr_errcode_reason(attr_errcode), sizeof(reason_phrase)-1)"
                     ,"false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_280,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x23c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_280,&local_278);
          testing::internal::AssertHelper::~AssertHelper(&local_280);
          std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_278);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        local_2b4 = STUN_ATTR_UNKNOWN_ATTRIBUTES;
        local_2b6 = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_2b0,"STUN_ATTR_UNKNOWN_ATTRIBUTES",
                   "stun_attr_type(attr_hdr)",&local_2b4,&local_2b6);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
        if (!bVar2) {
          testing::Message::Message(&local_2c0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&attr_unk,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x23f,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&attr_unk,&local_2c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&attr_unk);
          testing::Message::~Message(&local_2c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
        gtest_ar_8.message_ = gtest_ar_4.message_;
        local_2e8 = 3;
        local_2f0 = stun_attr_unknown_count((stun_attr_unknown *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_2e0,"(sizeof(unknown)/sizeof(unknown[0]))",
                   "stun_attr_unknown_count(attr_unk)",&local_2e8,&local_2f0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
        if (!bVar2) {
          testing::Message::Message(&local_2f8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x241,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_2f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
          testing::Message::~Message(&local_2f8);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          for (gtest_ar_9.message_.ptr_ =
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              gtest_ar_9.message_.ptr_ <
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
              gtest_ar_9.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(gtest_ar_9.message_.ptr_)->field_0x1) {
            pbVar1 = gtest_ar_9.message_.ptr_ + -1;
            local_31a = stun_attr_unknown_get
                                  ((stun_attr_unknown *)gtest_ar_8.message_.ptr_,
                                   (size_t)gtest_ar_9.message_.ptr_);
            testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
                      ((EqHelper<false> *)local_318,"unknown[i]",
                       "stun_attr_unknown_get(attr_unk, i)",
                       unknown + (long)&(pbVar1->field_2)._M_allocated_capacity + 0xc,&local_31a);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
            if (!bVar2) {
              testing::Message::Message(&local_328);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                         ,0x243,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_10.message_,&local_328);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
              testing::Message::~Message(&local_328);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
          }
          gtest_ar_4.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
          testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                    ((EqHelper<true> *)local_340,"__null","attr_hdr",(Secret *)0x0,
                     (_stun_attr_hdr *)gtest_ar_4.message_.ptr_);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
          if (!bVar2) {
            testing::Message::Message(&local_348);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
            testing::internal::AssertHelper::AssertHelper
                      (&local_350,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0x247,pcVar3);
            testing::internal::AssertHelper::operator=(&local_350,&local_348);
            testing::internal::AssertHelper::~AssertHelper(&local_350);
            testing::Message::~Message(&local_348);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(StunMsg, ErrorResponse) {
  const char reason_phrase[] = "Unknown Attribute";
  const uint8_t expected_result[] = {
    0x01,0x11,0x00,0x28, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x09,0x00,0x15, //    ERROR-CODE attribute header
    0x00,0x00,0x04,0x14, //    class = 4, code = 20 (420)
    0x55,0x6e,0x6b,0x6e, // }
    0x6f,0x77,0x6e,0x20, // }
    0x41,0x74,0x74,0x72, // }  Reason: Unknown Attribute
    0x69,0x62,0x75,0x74, // }
    0x65,0x00,0x00,0x00, // }
    0x00,0x0A,0x00,0x06, //    UNKNOWN-ATTRIBUTES attribute header
    0x00,0x1A,0x00,0x1B, //    0x001A, 0x001B
    0x80,0x2C,0x00,0x00, //    0x802C
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_ERROR_CODE_SIZE(sizeof(reason_phrase)-1)
    + STUN_ATTR_UNKNOWN_SIZE(3)];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };
  uint16_t unknown[] = { 0x001a, 0x001b, 0x802c };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr_init(msg_hdr, STUN_BINDING_ERROR_RESPONSE, tsx_id);
  stun_attr_errcode_add(msg_hdr, 420, reason_phrase, 0);
  stun_attr_unknown_add(msg_hdr, unknown, ARRAY_SIZE(unknown), 0);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_ERROR_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_ERROR_CODE, stun_attr_type(attr_hdr));
  stun_attr_errcode *attr_errcode = (stun_attr_errcode *)attr_hdr;
  EXPECT_EQ(420, stun_attr_errcode_status(attr_errcode));
  ASSERT_EQ(sizeof(reason_phrase)-1,
      stun_attr_errcode_reason_len(attr_errcode));
  EXPECT_TRUE(IsEqual(reason_phrase,
      stun_attr_errcode_reason(attr_errcode),
      sizeof(reason_phrase)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_UNKNOWN_ATTRIBUTES, stun_attr_type(attr_hdr));
  stun_attr_unknown *attr_unk = (stun_attr_unknown *)attr_hdr;
  ASSERT_EQ(ARRAY_SIZE(unknown), stun_attr_unknown_count(attr_unk));
  for (size_t i = 0; i < ARRAY_SIZE(unknown); i++) {
    EXPECT_EQ(unknown[i], stun_attr_unknown_get(attr_unk, i));
  }

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}